

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *pFxchMan,int iVarNew)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Entry;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  int fCompl;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  int local_4c;
  Vec_Int_t *local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  uVar13 = 0;
  while( true ) {
    uVar11 = (uint)uVar13 | 1;
    if (pFxchMan->vPairs->nSize <= (int)uVar11) {
      return;
    }
    iVar2 = Vec_IntEntry(pFxchMan->vPairs,(uint)uVar13);
    iVar3 = Vec_IntEntry(pFxchMan->vPairs,uVar11);
    fCompl = 0;
    pVVar5 = Fxch_ManGetCube(pFxchMan,iVar2);
    pVVar6 = Fxch_ManGetCube(pFxchMan,iVar3);
    local_68 = pVVar5;
    pVVar5 = Vec_IntDup(pVVar5);
    local_38 = Vec_IntDup(pVVar6);
    local_58 = pVVar5;
    iVar4 = Fxch_DivRemoveLits(pVVar5,local_38,pFxchMan->vDiv,&fCompl);
    if (iVar4 != pFxchMan->vDiv->nSize) break;
    pFxchMan->nLits = (pFxchMan->nLits - (iVar4 + pVVar6->nSize)) + 2;
    piVar7 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * iVar2);
    piVar8 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * iVar3);
    iVar4 = pFxchMan->nSizeOutputID;
    bVar14 = true;
    lVar10 = 0;
    while ((lVar10 < iVar4 && (bVar14))) {
      bVar14 = piVar7[lVar10] == piVar8[lVar10];
      lVar10 = lVar10 + 1;
    }
    if (bVar14) {
      local_68->nSize = 0;
      Vec_IntAppend(local_68,local_58);
      Vec_IntPush(pFxchMan->vCubesToUpdate,iVar2);
      pVVar6->nSize = 0;
      for (iVar2 = 0; pVVar5 = local_68, iVar2 < pFxchMan->vDiv->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(pFxchMan->vDiv,iVar2);
        pVVar1 = pFxchMan->vLits;
        iVar4 = Abc_Lit2Var(iVar3);
        pVVar6 = Vec_WecEntry(pVVar1,iVar4);
        pVVar5 = local_68;
        iVar4 = Vec_WecLevelId(pFxchMan->vCubes,local_68);
        Vec_IntRemove(pVVar6,iVar4);
        pVVar1 = pFxchMan->vLits;
        iVar3 = Abc_Lit2Var(iVar3);
        iVar3 = Abc_LitNot(iVar3);
        pVVar6 = Vec_WecEntry(pVVar1,iVar3);
        iVar3 = Vec_WecLevelId(pFxchMan->vCubes,pVVar5);
        Vec_IntRemove(pVVar6,iVar3);
      }
    }
    else {
      for (lVar10 = 0; lVar10 < iVar4; lVar10 = lVar10 + 1) {
        pFxchMan->pTempOutputID[lVar10] = piVar8[lVar10] & piVar7[lVar10];
        iVar4 = pFxchMan->nSizeOutputID;
      }
      local_4c = iVar3;
      local_48 = pVVar6;
      local_40 = uVar13;
      pVVar6 = Vec_WecPushLevel(pFxchMan->vCubes);
      Vec_IntAppend(pVVar6,local_58);
      Vec_IntPushArray(pFxchMan->vOutputID,pFxchMan->pTempOutputID,pFxchMan->nSizeOutputID);
      pVVar5 = pFxchMan->vCubesToUpdate;
      iVar3 = Vec_WecLevelId(pFxchMan->vCubes,pVVar6);
      Vec_IntPush(pVVar5,iVar3);
      local_60 = pVVar6;
      for (iVar3 = 1; uVar13 = local_40, pVVar5 = local_48, iVar4 = local_4c, iVar3 < pVVar6->nSize;
          iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(pVVar6,iVar3);
        pVVar1 = pFxchMan->vLits;
        Entry = Vec_WecLevelId(pFxchMan->vCubes,local_60);
        pVVar6 = local_60;
        Vec_WecPush(pVVar1,iVar4,Entry);
      }
      uVar11 = 0;
      for (lVar10 = 0; lVar10 < pFxchMan->nSizeOutputID; lVar10 = lVar10 + 1) {
        uVar12 = piVar7[lVar10];
        pFxchMan->pTempOutputID[lVar10] = uVar12;
        uVar12 = ~piVar8[lVar10] & uVar12;
        uVar11 = uVar11 | uVar12;
        piVar7[lVar10] = uVar12;
      }
      if (uVar11 == 0) {
        local_68->nSize = 0;
      }
      else {
        Vec_IntPush(pFxchMan->vCubesToUpdate,iVar2);
      }
      uVar11 = 0;
      for (lVar10 = 0; lVar10 < pFxchMan->nSizeOutputID; lVar10 = lVar10 + 1) {
        uVar12 = ~pFxchMan->pTempOutputID[lVar10] & piVar8[lVar10];
        uVar11 = uVar11 | uVar12;
        piVar8[lVar10] = uVar12;
      }
      if (uVar11 == 0) {
        pVVar5->nSize = 0;
        pVVar5 = local_60;
      }
      else {
        Vec_IntPush(pFxchMan->vCubesToUpdate,iVar4);
        pVVar5 = local_60;
      }
    }
    Vec_IntFree(local_58);
    Vec_IntFree(local_38);
    if (iVarNew != 0) {
      pVVar6 = Vec_WecEntry(pFxchMan->vLits,pFxchMan->vLits->nSize + -2);
      pVVar9 = Vec_WecEntry(pFxchMan->vLits,pFxchMan->vLits->nSize + -1);
      if (pVVar5 == (Vec_Int_t *)0x0) {
        __assert_fail("vCube",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x1ed,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
      }
      bVar14 = pFxchMan->vDiv->nSize == 2;
      if (fCompl != 0 || bVar14) {
        pVVar6 = pVVar9;
      }
      iVar2 = Abc_Var2Lit(iVarNew,(uint)(fCompl != 0 || bVar14));
      Vec_IntPush(pVVar5,iVar2);
      iVar2 = Vec_WecLevelId(pFxchMan->vCubes,pVVar5);
      Vec_IntPush(pVVar6,iVar2);
      Vec_IntSort(pVVar6,iVar2);
    }
    uVar13 = (ulong)((int)uVar13 + 2);
  }
  __assert_fail("RetValue == Vec_IntSize( pFxchMan->vDiv )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                ,0x19a,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
}

Assistant:

static inline void Fxch_ManExtractDivFromCubePairs( Fxch_Man_t* pFxchMan,
                                                   const int iVarNew )
{
    /* For each pair (Ci, Cj) */
    int iCube0, iCube1, i;


    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        int j, Lit,
            RetValue,
            fCompl = 0;
        int * pOutputID0, * pOutputID1;

        Vec_Int_t* vCube = NULL,
                 * vCube0 = Fxch_ManGetCube( pFxchMan, iCube0 ),
                 * vCube1 = Fxch_ManGetCube( pFxchMan, iCube1 ),
                 * vCube0Copy = Vec_IntDup( vCube0 ),
                 * vCube1Copy = Vec_IntDup( vCube1 );

        RetValue  = Fxch_DivRemoveLits( vCube0Copy, vCube1Copy, pFxchMan->vDiv, &fCompl );

        assert( RetValue == Vec_IntSize( pFxchMan->vDiv ) );

        pFxchMan->nLits -= Vec_IntSize( pFxchMan->vDiv ) + Vec_IntSize( vCube1 ) - 2;

        /* Identify type of Extraction */
        pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
        pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
        RetValue = 1;
        for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
            RetValue = ( pOutputID0[j] == pOutputID1[j] );

        /* Exact Extractraion */
        if ( RetValue )
        {
            Vec_IntClear( vCube0 );
            Vec_IntAppend( vCube0, vCube0Copy );
            vCube = vCube0;

            Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            Vec_IntClear( vCube1 );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntry( pFxchMan->vDiv, Lit, j )
            {
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_Lit2Var( Lit ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Abc_Lit2Var( Lit ) ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
            }

        }
        /* Unexact Extraction */
        else
        {
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                pFxchMan->pTempOutputID[j] = ( pOutputID0[j] & pOutputID1[j] );

            /* Create new cube */
            vCube = Vec_WecPushLevel( pFxchMan->vCubes );
            Vec_IntAppend( vCube, vCube0Copy );
            Vec_IntPushArray( pFxchMan->vOutputID, pFxchMan->pTempOutputID, pFxchMan->nSizeOutputID );
            Vec_IntPush( pFxchMan->vCubesToUpdate, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntryStart( vCube, Lit, j, 1 )
                Vec_WecPush( pFxchMan->vLits, Lit, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                pFxchMan->pTempOutputID[j] = pOutputID0[j];
                RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                pOutputID0[j] &= ~( pOutputID1[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            else
                Vec_IntClear( vCube0 );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                RetValue |= ( pOutputID1[j] & ~( pFxchMan->pTempOutputID[j] ) );
                pOutputID1[j] &= ~( pFxchMan->pTempOutputID[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube1 );
            else
                Vec_IntClear( vCube1 );

        }
        Vec_IntFree( vCube0Copy );
        Vec_IntFree( vCube1Copy );

        if ( iVarNew )
        {
            Vec_Int_t* vLitP = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 2 ),
                     * vLitN = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 1 );

            assert( vCube );
            if ( Vec_IntSize( pFxchMan->vDiv ) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 1 ) );
                Vec_IntPush( vLitN, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitN, 0 );
            }
            else
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 0 ) );
                Vec_IntPush( vLitP, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitP, 0 );
            }
        }
    }

    return;
}